

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerResults.cpp
# Opt level: O0

void __thiscall
HD44780AnalyzerResults::GenerateBubbleText
          (HD44780AnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  char *__dest;
  undefined8 local_300;
  undefined8 uStack_2f8;
  ulonglong local_2f0;
  ushort local_2e0;
  undefined8 uStack_2d8;
  Frame frame;
  char local_2a8 [8];
  char number_str [128];
  char s2 [256];
  char s1 [256];
  DisplayBase display_base_local;
  Channel *channel_local;
  U64 frame_index_local;
  HD44780AnalyzerResults *this_local;
  
  Frame::Frame((Frame *)&uStack_2d8);
  AnalyzerResults::GetFrame((ulonglong)&local_300);
  uStack_2d8 = local_300;
  _frame = uStack_2f8;
  Frame::~Frame((Frame *)&local_300);
  AnalyzerResults::ClearResultStrings();
  AnalyzerHelpers::GetNumberString(local_2f0,display_base,8,local_2a8,0x80);
  strcpy(s2 + 0xf8,local_2a8);
  AnalyzerResults::AddResultString
            ((char *)this,s2 + 0xf8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if ((local_2e0 & 0x200) == 0) {
    strcpy(s2 + 0xf8,"W");
  }
  else {
    strcpy(s2 + 0xf8,"R");
  }
  if ((local_2e0 & 0x100) == 0) {
    strcat(s2 + 0xf8,"C ");
  }
  else {
    strcat(s2 + 0xf8,"D ");
  }
  strcat(s2 + 0xf8,local_2a8);
  AnalyzerResults::AddResultString
            ((char *)this,s2 + 0xf8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if ((local_2e0 & 0x200) == 0) {
    strcpy(s2 + 0xf8,"Wr ");
  }
  else {
    strcpy(s2 + 0xf8,"Rd ");
  }
  if ((local_2e0 & 0x100) == 0) {
    strcat(s2 + 0xf8,"Cm ");
  }
  else {
    strcat(s2 + 0xf8,"Dt ");
  }
  strcat(s2 + 0xf8,local_2a8);
  AnalyzerResults::AddResultString
            ((char *)this,s2 + 0xf8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if ((local_2e0 & 0x200) == 0) {
    strcpy(s2 + 0xf8,"Write ");
  }
  else {
    strcpy(s2 + 0xf8,"Read ");
  }
  if ((local_2e0 & 0x100) == 0) {
    strcat(s2 + 0xf8,"Command ");
  }
  else {
    strcat(s2 + 0xf8,"Data ");
  }
  strcat(s2 + 0xf8,local_2a8);
  AnalyzerResults::AddResultString
            ((char *)this,s2 + 0xf8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  HD44780Decode(this,(Frame *)&uStack_2d8,number_str + 0x78,display_base);
  __dest = s2 + 0xf8;
  strcat(__dest," (");
  strcat(__dest,number_str + 0x78);
  strcat(__dest,")");
  AnalyzerResults::AddResultString
            ((char *)this,__dest,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame((Frame *)&uStack_2d8);
  return;
}

Assistant:

void HD44780AnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    char s1[ 256 ], s2[ 256 ], number_str[ 128 ];
    Frame frame;

    frame = GetFrame( frame_index );
    ClearResultStrings();
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    // string 1
    strcpy( s1, number_str );
    AddResultString( s1 );

    // string 2
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "R" );
    else
        strcpy( s1, "W" );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "D " );
    else
        strcat( s1, "C " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 3
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Rd " );
    else
        strcpy( s1, "Wr " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Dt " );
    else
        strcat( s1, "Cm " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 4
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Read " );
    else
        strcpy( s1, "Write " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Data " );
    else
        strcat( s1, "Command " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 5 (adds to string 4)
    HD44780Decode( &frame, s2, display_base );
    strcat( s1, " (" );
    strcat( s1, s2 );
    strcat( s1, ")" );
    AddResultString( s1 );
}